

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O0

void * Int2_ManReadInterpolant(sat_solver2 *pSat)

{
  Gia_Man_t *p_00;
  int iVar1;
  Gia_Man_t *pGia;
  Gia_Man_t *pTemp;
  Int2_Man_t *p;
  sat_solver2 *pSat_local;
  
  p_00 = pSat->pInt2->pGia;
  pSat->pInt2->pGia = (Gia_Man_t *)0x0;
  if (pSat->hProofLast == -1) {
    pSat_local = (sat_solver2 *)0x0;
  }
  else {
    iVar1 = Gia_ManPoNum(p_00);
    if (iVar1 != 0) {
      __assert_fail("Gia_ManPoNum(pGia) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2i.c"
                    ,0x58,"void *Int2_ManReadInterpolant(sat_solver2 *)");
    }
    Gia_ManAppendCo(p_00,pSat->hProofLast);
    pSat->hProofLast = -1;
    pSat_local = (sat_solver2 *)Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
  }
  return pSat_local;
}

Assistant:

void * Int2_ManReadInterpolant( sat_solver2 * pSat )
{
    Int2_Man_t * p = pSat->pInt2;
    Gia_Man_t * pTemp, * pGia = p->pGia; p->pGia = NULL;
    // return NULL, if the interpolant is not ready (for example, when the solver returned 'sat')
    if ( pSat->hProofLast == -1 )
        return NULL;
    // create AIG with one primary output
    assert( Gia_ManPoNum(pGia) == 0 );
    Gia_ManAppendCo( pGia, pSat->hProofLast );  
    pSat->hProofLast = -1;
    // cleanup the resulting AIG
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return (void *)pGia;
}